

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<const_glu::ShaderProgram>::SharedPtr
          (SharedPtr<const_glu::ShaderProgram> *this,ShaderProgram *ptr)

{
  ShaderProgram *pSVar1;
  SharedPtrState<const_glu::ShaderProgram,_de::DefaultDeleter<const_glu::ShaderProgram>_> *pSVar2;
  DefaultDeleter<const_glu::ShaderProgram> local_25 [13];
  ShaderProgram *local_18;
  ShaderProgram *ptr_local;
  SharedPtr<const_glu::ShaderProgram> *this_local;
  
  this->m_ptr = (ShaderProgram *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (ShaderProgram *)this;
  pSVar2 = (SharedPtrState<const_glu::ShaderProgram,_de::DefaultDeleter<const_glu::ShaderProgram>_>
            *)operator_new(0x20);
  pSVar1 = local_18;
  DefaultDeleter<const_glu::ShaderProgram>::DefaultDeleter(local_25);
  SharedPtrState<const_glu::ShaderProgram,_de::DefaultDeleter<const_glu::ShaderProgram>_>::
  SharedPtrState(pSVar2,pSVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}